

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

int __thiscall ProString::lastIndexOf(ProString *this,QString *s,int from,CaseSensitivity cs)

{
  CutResult CVar1;
  int iVar2;
  char16_t *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  long local_38;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (this->m_string).d.ptr;
  local_30 = (long)this->m_offset;
  local_38 = (long)this->m_length;
  CVar1 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_30,&local_38);
  if (CVar1 == Null) {
    lVar4 = 0;
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = pcVar3 + local_30;
    lVar4 = local_38;
  }
  QVar5.m_data = pcVar3;
  QVar5.m_size = lVar4;
  QVar6.m_data = (s->d).ptr;
  QVar6.m_size = (s->d).size;
  iVar2 = QtPrivate::lastIndexOf(QVar5,(long)from,QVar6,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int lastIndexOf(const QString &s, int from = -1, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().lastIndexOf(s, from, cs); }